

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O1

void __thiscall xLearn::Trainer::Train(Trainer *this)

{
  pointer ppRVar1;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> te_reader;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> tr_reader;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> local_48;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> local_28;
  
  local_28.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<xLearn::Reader*,std::allocator<xLearn::Reader*>>::
  _M_realloc_insert<xLearn::Reader*const&>
            ((vector<xLearn::Reader*,std::allocator<xLearn::Reader*>> *)&local_28,(iterator)0x0,
             (this->reader_list_).
             super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_48.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppRVar1 = (this->reader_list_).
            super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(this->reader_list_).
            super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)ppRVar1 == 0x10) {
    std::vector<xLearn::Reader*,std::allocator<xLearn::Reader*>>::
    _M_realloc_insert<xLearn::Reader*const&>
              ((vector<xLearn::Reader*,std::allocator<xLearn::Reader*>> *)&local_48,(iterator)0x0,
               ppRVar1 + 1);
  }
  train(this,&local_28,&local_48);
  if (local_48.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Trainer::Train() {
  // Get train Reader and test Reader
  std::vector<Reader*> tr_reader;
  tr_reader.push_back(reader_list_[0]);
  std::vector<Reader*> te_reader;
  if (reader_list_.size() == 2) {
    te_reader.push_back(reader_list_[1]);
  }
  this->train(tr_reader, te_reader);
}